

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Graph_Color::optimize_mir
          (Graph_Color *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Base_ptr p_Var1;
  mapped_type *pmVar2;
  _Self __tmp;
  allocator<char> local_69;
  key_type local_68;
  string local_48;
  
  for (p_Var1 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(package->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::string((string *)&local_48,(string *)(p_Var1 + 1));
    optimize_func(this,&local_48,(MirFunction *)(p_Var1 + 2));
    std::__cxx11::string::~string((string *)&local_48);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::operator[](extra_data_repo,&this->name);
  std::any::operator=(pmVar2,&this->func_color_map);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"unused_colors",&local_69);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::operator[](extra_data_repo,&local_68);
  std::any::operator=(pmVar2,&this->func_unused_colors);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      optimize_func(iter->first, iter->second);
    }
    extra_data_repo[name] = func_color_map;
    extra_data_repo["unused_colors"] = func_unused_colors;
  }